

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffix_tree.cpp
# Opt level: O0

SuffixTreeInternalNode * __thiscall
wasm::SuffixTree::insertInternalNode
          (SuffixTree *this,SuffixTreeInternalNode *Parent,uint StartIdx,uint EndIdx,uint Edge)

{
  bool bVar1;
  SuffixTreeInternalNode *this_00;
  mapped_type *ppSVar2;
  SuffixTreeInternalNode *N;
  uint local_20;
  uint Edge_local;
  uint EndIdx_local;
  uint StartIdx_local;
  SuffixTreeInternalNode *Parent_local;
  SuffixTree *this_local;
  
  N._4_4_ = Edge;
  local_20 = EndIdx;
  Edge_local = StartIdx;
  _EndIdx_local = Parent;
  Parent_local = (SuffixTreeInternalNode *)this;
  if (EndIdx < StartIdx) {
    __assert_fail("StartIdx <= EndIdx && \"String can\'t start after it ends!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                  ,0x48,
                  "SuffixTreeInternalNode *wasm::SuffixTree::insertInternalNode(SuffixTreeInternalNode *, unsigned int, unsigned int, unsigned int)"
                 );
  }
  if ((Parent != (SuffixTreeInternalNode *)0x0) || (bVar1 = false, StartIdx == 0xffffffff)) {
    bVar1 = true;
  }
  if (bVar1) {
    this_00 = llvm::SpecificBumpPtrAllocator<wasm::SuffixTreeInternalNode>::Allocate
                        (&this->InternalNodeAllocator,1);
    SuffixTreeInternalNode::SuffixTreeInternalNode(this_00,Edge_local,local_20,this->Root);
    if (_EndIdx_local != (SuffixTreeInternalNode *)0x0) {
      ppSVar2 = std::
                unordered_map<unsigned_int,_wasm::SuffixTreeNode_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SuffixTreeNode_*>_>_>
                ::operator[](&_EndIdx_local->Children,(key_type *)((long)&N + 4));
      *ppSVar2 = &this_00->super_SuffixTreeNode;
    }
    return this_00;
  }
  __assert_fail("!(!Parent && StartIdx != SuffixTreeNode::EmptyIdx) && \"Non-root internal nodes must have parents!\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/suffix_tree.cpp"
                ,0x4a,
                "SuffixTreeInternalNode *wasm::SuffixTree::insertInternalNode(SuffixTreeInternalNode *, unsigned int, unsigned int, unsigned int)"
               );
}

Assistant:

SuffixTreeInternalNode*
SuffixTree::insertInternalNode(SuffixTreeInternalNode* Parent,
                               unsigned StartIdx,
                               unsigned EndIdx,
                               unsigned Edge) {
  assert(StartIdx <= EndIdx && "String can't start after it ends!");
  assert(!(!Parent && StartIdx != SuffixTreeNode::EmptyIdx) &&
         "Non-root internal nodes must have parents!");
  auto* N = new (InternalNodeAllocator.Allocate())
    SuffixTreeInternalNode(StartIdx, EndIdx, Root);
  if (Parent) {
    Parent->Children[Edge] = N;
  }
  return N;
}